

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplesignal.h
# Opt level: O0

bool __thiscall
Simple::Lib::ProtoSignal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>::SignalLink::
remove_sibling(SignalLink *this,size_t id)

{
  SignalLink *in_RSI;
  SignalLink *in_RDI;
  SignalLink *link;
  SignalLink *local_30;
  SignalLink *local_20;
  
  local_30 = in_RDI;
  if (in_RDI->next != (SignalLink *)0x0) {
    local_30 = in_RDI->next;
  }
  local_20 = local_30;
  while( true ) {
    if (local_20 == in_RDI) {
      return false;
    }
    if (in_RSI == local_20) break;
    local_20 = local_20->next;
  }
  unlink(local_20,(char *)in_RSI);
  return true;
}

Assistant:

bool remove_sibling(size_t id) {
      for (SignalLink *link = this->next ? this->next : this; link != this;
           link = link->next)
        if (id == size_t(link)) {
          link->unlink();  // deactivate and unlink sibling
          return true;
        }
      return false;
    }